

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O1

DebugClient * __thiscall
PoolList<ProxyServer::DebugClient>::append<ProxyServer::DebugListener&,Server::Client&>
          (PoolList<ProxyServer::DebugClient> *this,DebugListener *a,Client *b)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  DebugClient *pDVar4;
  PoolList<ProxyServer::DebugClient> *pPVar5;
  
  pDVar4 = allocateFreeItem(this);
  (pDVar4->super_ICallback)._vptr_ICallback = (_func_int **)&PTR_onRead_00125cb8;
  pDVar4->_parent = a;
  pDVar4->_handle = b;
  pIVar1 = (this->_end).item;
  pIVar2 = this->freeItem;
  this->freeItem = pIVar2->prev;
  pIVar3 = pIVar1->prev;
  pIVar2->prev = pIVar3;
  pPVar5 = this;
  if (pIVar3 != (Item *)0x0) {
    pPVar5 = (PoolList<ProxyServer::DebugClient> *)pIVar1->prev;
  }
  (pPVar5->_begin).item = pIVar2;
  pIVar2->next = pIVar1;
  pIVar1->prev = pIVar2;
  this->_size = this->_size + 1;
  return pDVar4;
}

Assistant:

T& append(A a, B b) {return linkFreeItem(new (allocateFreeItem()) T(a, b));}